

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * cmGlobalNinjaGenerator::EncodeLiteral(string *__return_storage_ptr__,string *lit)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (lit->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + lit->_M_string_length);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"$","$$");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,"\n","$\n");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeLiteral(const std::string& lit)
{
  std::string result = lit;
  cmSystemTools::ReplaceString(result, "$", "$$");
  cmSystemTools::ReplaceString(result, "\n", "$\n");
  return result;
}